

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::writeOptions(Highs *this,string *filename,bool report_only_deviations)

{
  bool bVar1;
  undefined8 uVar2;
  byte in_DL;
  string *in_RSI;
  string *in_RDI;
  HighsFileType file_type;
  FILE *file;
  HighsStatus return_status;
  HighsFileType in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  Highs *in_stack_fffffffffffffe20;
  allocator *paVar3;
  HighsLogOptions *log_options;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  HighsFileType *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  string *psVar4;
  HighsStatus in_stack_fffffffffffffe68;
  HighsStatus in_stack_fffffffffffffe6c;
  HighsLogOptions *in_stack_fffffffffffffe70;
  allocator local_109;
  string local_108 [39];
  undefined1 local_e1 [49];
  string local_b0 [132];
  undefined4 local_2c;
  FILE *local_28;
  HighsStatus local_20;
  byte local_19;
  string *local_18;
  HighsStatus local_4;
  
  local_19 = in_DL & 1;
  local_18 = in_RSI;
  logHeader(in_stack_fffffffffffffe20);
  local_20 = 0;
  HighsLogOptions::HighsLogOptions
            ((HighsLogOptions *)in_stack_fffffffffffffe20,
             (HighsLogOptions *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  std::__cxx11::string::string(local_b0,local_18);
  psVar4 = (string *)local_e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_e1 + 1),"writeOptions",(allocator *)psVar4);
  openWriteFile((Highs *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),in_RDI,psVar4
                ,(FILE **)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                in_stack_fffffffffffffe48);
  paVar3 = &local_109;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"openWriteFile",paVar3);
  local_20 = interpretCallStatus(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
                                 in_stack_fffffffffffffe68,in_RDI);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::__cxx11::string::~string((string *)(local_e1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_e1);
  std::__cxx11::string::~string(local_b0);
  HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x484070);
  if (local_20 == kError) {
    local_4 = local_20;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffe20,
                            (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    if (bVar1) {
      local_2c = 0;
    }
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffe20,
                            (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    if (bVar1) {
      psVar4 = in_RDI + 0x71;
      uVar2 = std::__cxx11::string::c_str();
      highsLogUser((HighsLogOptions *)&psVar4->_M_string_length,kInfo,
                   "Writing the option values to %s\n",uVar2);
    }
    log_options = (HighsLogOptions *)&in_RDI[0x71]._M_string_length;
    HighsLogOptions::HighsLogOptions
              ((HighsLogOptions *)in_stack_fffffffffffffe20,
               (HighsLogOptions *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    writeOptionsToFile((FILE *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       log_options,
                       (vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *)
                       in_stack_fffffffffffffe20,SUB41((uint)in_stack_fffffffffffffe1c >> 0x18,0),
                       in_stack_fffffffffffffe18);
    paVar3 = (allocator *)&stack0xfffffffffffffe6f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xfffffffffffffe70,"writeOptionsToFile",paVar3);
    local_20 = interpretCallStatus(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
                                   in_stack_fffffffffffffe68,in_RDI);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe70);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe6f);
    HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x484298);
    if (local_28 != _stdout) {
      fclose(local_28);
    }
    local_4 = local_20;
  }
  return local_4;
}

Assistant:

HighsStatus Highs::writeOptions(const std::string& filename,
                                const bool report_only_deviations) {
  this->logHeader();
  HighsStatus return_status = HighsStatus::kOk;
  FILE* file;
  HighsFileType file_type;
  return_status = interpretCallStatus(
      options_.log_options,
      openWriteFile(filename, "writeOptions", file, file_type), return_status,
      "openWriteFile");
  if (return_status == HighsStatus::kError) return return_status;
  if (filename == "") file_type = HighsFileType::kMinimal;
  // Report to user that options are being written to a file
  if (filename != "")
    highsLogUser(options_.log_options, HighsLogType::kInfo,
                 "Writing the option values to %s\n", filename.c_str());
  return_status = interpretCallStatus(
      options_.log_options,
      writeOptionsToFile(file, options_.log_options, options_.records,
                         report_only_deviations, file_type),
      return_status, "writeOptionsToFile");
  if (file != stdout) fclose(file);
  return return_status;
}